

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall Am_Slot_Iterator::Start(Am_Slot_Iterator *this)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Object_Data *pAVar3;
  Am_Object_Data *cont_data;
  Am_Slot_Iterator *this_local;
  
  bVar1 = Am_Object::Valid(&this->context);
  if (bVar1) {
    pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&this->context);
    pAVar3 = Am_Object_Data::Narrow(pAVar2);
    this->data->curr_obj = pAVar3;
    this->data->curr_pos = 0;
    pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&this->context);
    pAVar3 = Am_Object_Data::Narrow(pAVar2);
    Am_Slot_Iterator_Data::Find_Actual(this->data,pAVar3);
    Am_Wrapper::Release(&pAVar3->super_Am_Wrapper);
  }
  return;
}

Assistant:

void
Am_Slot_Iterator::Start()
{
  if (context.Valid()) {
    data->curr_obj = Am_Object_Data::Narrow(context);
    data->curr_pos = 0;
    Am_Object_Data *cont_data = Am_Object_Data::Narrow(context);
    data->Find_Actual(cont_data);
    cont_data->Release();
  }
}